

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O3

Closure * luaF_newLclosure(lua_State *L,int nelems,Table *e)

{
  GCObject *o;
  
  o = (GCObject *)luaM_realloc_(L,(void *)0x0,0,(long)(nelems * 8 + 0x28));
  luaC_link(L,o,'\x06');
  (o->h).flags = '\0';
  (o->h).array = (TValue *)e;
  (o->h).lsizenode = (lu_byte)nelems;
  if (nelems != 0) {
    memset((void *)((long)o + (long)(int)(nelems - 1U) * 8 + (ulong)(nelems - 1U) * -8 + 0x28),0,
           (ulong)(uint)nelems << 3);
  }
  return (Closure *)o;
}

Assistant:

Closure *luaF_newLclosure (lua_State *L, int nelems, Table *e) {
  Closure *c = cast(Closure *, luaM_malloc(L, sizeLclosure(nelems)));
  luaC_link(L, obj2gco(c), LUA_TFUNCTION);
  c->l.isC = 0;
  c->l.env = e;
  c->l.nupvalues = cast_byte(nelems);
  while (nelems--) c->l.upvals[nelems] = NULL;
  return c;
}